

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCDOrderParameter.cpp
# Opt level: O2

void __thiscall
OpenMD::SCDOrderParameter::SCDOrderParameter
          (SCDOrderParameter *this,SimInfo *info,string *filename,string *molname,int beginIndex,
          int endIndex)

{
  pointer pdVar1;
  pointer pdVar2;
  uint base;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  string selectionTemplate;
  SCDElem local_110;
  string sele3;
  string sele2;
  string sele1;
  
  pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  StaticAnalyser::StaticAnalyser(&this->super_StaticAnalyser,info,filename,1);
  (this->super_StaticAnalyser)._vptr_StaticAnalyser = (_func_int **)&PTR__SCDOrderParameter_002ee6e0
  ;
  (this->scdElems_).super__Vector_base<OpenMD::SCDElem,_std::allocator<OpenMD::SCDElem>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->scdElems_).super__Vector_base<OpenMD::SCDElem,_std::allocator<OpenMD::SCDElem>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->scdElems_).super__Vector_base<OpenMD::SCDElem,_std::allocator<OpenMD::SCDElem>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->scdParam_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->scdParam_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->scdParam_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  getPrefix(&selectionTemplate,filename);
  std::operator+(&local_110.sele1_,&selectionTemplate,".scd");
  std::__cxx11::string::_M_assign((string *)&(this->super_StaticAnalyser).outputFilename_);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&selectionTemplate);
  for (; base = (uint)pbVar3, beginIndex <= endIndex + -2; beginIndex = beginIndex + 1) {
    std::operator+(&local_110.sele1_,"select ",molname);
    std::operator+(&selectionTemplate,&local_110.sele1_,".");
    std::__cxx11::string::~string((string *)&local_110);
    OpenMD_itoa_abi_cxx11_(&local_110.sele1_,(OpenMD *)(ulong)(uint)beginIndex,10,base);
    std::operator+(&sele1,&selectionTemplate,&local_110.sele1_);
    std::__cxx11::string::~string((string *)&local_110);
    OpenMD_itoa_abi_cxx11_(&local_110.sele1_,(OpenMD *)(ulong)(beginIndex + 1),10,base);
    std::operator+(&sele2,&selectionTemplate,&local_110.sele1_);
    std::__cxx11::string::~string((string *)&local_110);
    OpenMD_itoa_abi_cxx11_(&local_110.sele1_,(OpenMD *)(ulong)(beginIndex + 2),10,base);
    std::operator+(&sele3,&selectionTemplate,&local_110.sele1_);
    std::__cxx11::string::~string((string *)&local_110);
    pbVar3 = &sele2;
    SCDElem::SCDElem(&local_110,info,&sele1,&sele2,&sele3);
    std::vector<OpenMD::SCDElem,_std::allocator<OpenMD::SCDElem>_>::emplace_back<OpenMD::SCDElem>
              (&this->scdElems_,&local_110);
    SCDElem::~SCDElem(&local_110);
    std::__cxx11::string::~string((string *)&sele3);
    std::__cxx11::string::~string((string *)&sele2);
    std::__cxx11::string::~string((string *)&sele1);
    std::__cxx11::string::~string((string *)&selectionTemplate);
  }
  std::vector<double,_std::allocator<double>_>::resize
            (&this->scdParam_,
             (long)(this->scdElems_).
                   super__Vector_base<OpenMD::SCDElem,_std::allocator<OpenMD::SCDElem>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->scdElems_).
                   super__Vector_base<OpenMD::SCDElem,_std::allocator<OpenMD::SCDElem>_>._M_impl.
                   super__Vector_impl_data._M_start >> 7);
  pdVar1 = (this->scdParam_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pdVar2 = (this->scdParam_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start; pdVar2 != pdVar1; pdVar2 = pdVar2 + 1) {
    *pdVar2 = 0.0;
  }
  return;
}

Assistant:

SCDOrderParameter::SCDOrderParameter(SimInfo* info,
                                       const std::string& filename,
                                       const std::string& molname,
                                       int beginIndex, int endIndex) :
      StaticAnalyser(info, filename, 1) {
    setOutputName(getPrefix(filename) + ".scd");

    assert(beginIndex >= 0 && endIndex >= 0 && beginIndex <= endIndex - 2);
    for (int i = beginIndex; i <= endIndex - 2; ++i) {
      std::string selectionTemplate = "select " + molname + ".";
      std::string sele1             = selectionTemplate + OpenMD_itoa(i);
      std::string sele2             = selectionTemplate + OpenMD_itoa(i + 1);
      std::string sele3             = selectionTemplate + OpenMD_itoa(i + 2);

      scdElems_.push_back(SCDElem(info, sele1, sele2, sele3));
    }

    scdParam_.resize(scdElems_.size());
    std::fill(scdParam_.begin(), scdParam_.end(), 0.0);
  }